

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O0

QStringList * __thiscall QDeviceDiscoveryUDev::scanConnectedDevices(QDeviceDiscoveryUDev *this)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  QDebug *o;
  QByteArrayView *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QLatin1StringView QVar8;
  udev_device *pci;
  udev_device *udevice;
  char *syspath;
  udev_list_entry *entry;
  udev_enumerate *ue;
  QStringList *devices;
  QString candidate;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  byte in_stack_fffffffffffffebe;
  byte in_stack_fffffffffffffebf;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *data;
  QDebug *in_stack_fffffffffffffed8;
  char *in_stack_ffffffffffffff08;
  long local_f0;
  QDebug local_a8;
  QDebug local_a0;
  QDebug local_98;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_8c;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_88;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_84;
  undefined8 local_80;
  storage_type *local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  char local_50 [32];
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_30;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_2c;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_28;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_24;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_20;
  QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4> local_1c;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->category)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  *(QString **)&in_RDI->control = (QString *)0xaaaaaaaaaaaaaaaa;
  in_RDI[1].category = (QLoggingCategory *)0xaaaaaaaaaaaaaaaa;
  data = in_RDI;
  QList<QString>::QList((QList<QString> *)0x113b77);
  if (in_RSI[1].m_data != (char *)0x0) {
    uVar4 = udev_enumerate_new(in_RSI[1].m_data);
    udev_enumerate_add_match_subsystem(uVar4,"input");
    udev_enumerate_add_match_subsystem(uVar4,"drm");
    local_1c.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                    CONCAT13(in_stack_fffffffffffffebf,
                             CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    if (IVar2 != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_MOUSE","1");
    }
    local_20.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                    CONCAT13(in_stack_fffffffffffffebf,
                             CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
    if (IVar2 != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TOUCHPAD","1");
    }
    local_24.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                    CONCAT13(in_stack_fffffffffffffebf,
                             CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    if (IVar2 != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TOUCHSCREEN","1");
    }
    local_28.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                    CONCAT13(in_stack_fffffffffffffebf,
                             CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
    if (IVar2 != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_KEYBOARD","1");
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_KEY","1");
    }
    local_2c.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                    CONCAT13(in_stack_fffffffffffffebf,
                             CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    if (IVar2 != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_TABLET","1");
    }
    local_30.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
         (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
         QFlags<QDeviceDiscovery::QDeviceType>::operator&
                   ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                    CONCAT13(in_stack_fffffffffffffebf,
                             CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
    if (IVar2 != 0) {
      udev_enumerate_add_match_property(uVar4,"ID_INPUT_JOYSTICK","1");
    }
    iVar3 = udev_enumerate_scan_devices(uVar4);
    if (iVar3 == 0) {
      for (local_f0 = udev_enumerate_get_list_entry(uVar4); local_f0 != 0;
          local_f0 = udev_list_entry_get_next(local_f0)) {
        in_stack_ffffffffffffff08 = (char *)udev_list_entry_get_name(local_f0);
        uVar5 = udev_device_new_from_syspath(in_RSI[1].m_data,in_stack_ffffffffffffff08);
        local_68 = 0xaaaaaaaaaaaaaaaa;
        local_60 = 0xaaaaaaaaaaaaaaaa;
        local_58 = 0xaaaaaaaaaaaaaaaa;
        local_80 = udev_device_get_devnode(uVar5);
        QByteArrayView::QByteArrayView<const_char_*,_true>(in_RSI,(char **)data);
        QVar7.m_data = local_78;
        QVar7.m_size = (qsizetype)&local_68;
        QString::fromUtf8(QVar7);
        local_84.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
             (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
             QFlags<QDeviceDiscovery::QDeviceType>::operator&
                       ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                        CONCAT13(in_stack_fffffffffffffebf,
                                 CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
        IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
        in_stack_fffffffffffffebf = 0;
        if (IVar2 != 0) {
          QVar8 = Qt::Literals::StringLiterals::operator____L1((char *)data,(size_t)in_RDI);
          in_stack_fffffffffffffebf =
               QString::startsWith((QLatin1String *)&local_68,(CaseSensitivity)QVar8.m_size);
        }
        if ((in_stack_fffffffffffffebf & 1) != 0) {
          QList<QString>::operator<<
                    ((QList<QString> *)in_RDI,
                     (parameter_type)
                     CONCAT17(in_stack_fffffffffffffebf,
                              CONCAT16(in_stack_fffffffffffffebe,
                                       CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                                      )));
        }
        local_88.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
             (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
             QFlags<QDeviceDiscovery::QDeviceType>::operator&
                       ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                        CONCAT13(in_stack_fffffffffffffebf,
                                 CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
        IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_88);
        in_stack_fffffffffffffebe = 0;
        if (IVar2 != 0) {
          QVar8 = Qt::Literals::StringLiterals::operator____L1((char *)data,(size_t)in_RDI);
          in_stack_fffffffffffffebe =
               QString::startsWith((QLatin1String *)&local_68,(CaseSensitivity)QVar8.m_size);
        }
        if ((in_stack_fffffffffffffebe & 1) != 0) {
          local_8c.super_QFlagsStorage<QDeviceDiscovery::QDeviceType>.i =
               (QFlagsStorage<QDeviceDiscovery::QDeviceType>)
               QFlags<QDeviceDiscovery::QDeviceType>::operator&
                         ((QFlags<QDeviceDiscovery::QDeviceType> *)in_RDI,
                          CONCAT13(in_stack_fffffffffffffebf,
                                   CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)));
          IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
          if (IVar2 == 0) {
            QList<QString>::operator<<
                      ((QList<QString> *)in_RDI,
                       (parameter_type)
                       CONCAT17(in_stack_fffffffffffffebf,
                                CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT24(in_stack_fffffffffffffebc,
                                                  in_stack_fffffffffffffeb8))));
          }
          else {
            in_stack_fffffffffffffed8 =
                 (QDebug *)udev_device_get_parent_with_subsystem_devtype(uVar5,"pci",0);
            if (in_stack_fffffffffffffed8 != (QDebug *)0x0) {
              pcVar6 = (char *)udev_device_get_sysattr_value(in_stack_fffffffffffffed8,"boot_vga");
              iVar3 = qstrcmp(pcVar6,"1");
              if (iVar3 == 0) {
                QList<QString>::operator<<
                          ((QList<QString> *)in_RDI,
                           (parameter_type)
                           CONCAT17(in_stack_fffffffffffffebf,
                                    CONCAT16(in_stack_fffffffffffffebe,
                                             CONCAT24(in_stack_fffffffffffffebc,
                                                      in_stack_fffffffffffffeb8))));
              }
            }
          }
        }
        udev_device_unref(uVar5);
        QString::~QString((QString *)0x114047);
      }
      udev_enumerate_unref(uVar4);
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      lcDD();
      anon_unknown.dwarf_84190::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_RDI,(QLoggingCategory *)
                        CONCAT17(in_stack_fffffffffffffebf,
                                 CONCAT16(in_stack_fffffffffffffebe,
                                          CONCAT24(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8))));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_84190::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1140bb);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RSI,(char *)data,(int)((ulong)in_RDI >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffebf,
                                    CONCAT16(in_stack_fffffffffffffebe,
                                             CONCAT24(in_stack_fffffffffffffebc,
                                                      in_stack_fffffffffffffeb8))),(char *)0x1140d4)
        ;
        QMessageLogger::debug();
        o = QDebug::operator<<(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_a0,o);
        operator<<(in_stack_fffffffffffffed8,(QList<QString> *)in_RSI);
        QDebug::~QDebug(&local_98);
        QDebug::~QDebug(&local_a0);
        QDebug::~QDebug(&local_a8);
        local_10 = local_10 & 0xffffffffffffff00;
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RSI,(char *)data,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffebf,
                                  CONCAT16(in_stack_fffffffffffffebe,
                                           CONCAT24(in_stack_fffffffffffffebc,
                                                    in_stack_fffffffffffffeb8))));
      QMessageLogger::warning(local_50,"Failed to scan devices");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)data;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QDeviceDiscoveryUDev::scanConnectedDevices()
{
    QStringList devices;

    if (!m_udev)
        return devices;

    udev_enumerate *ue = udev_enumerate_new(m_udev);
    udev_enumerate_add_match_subsystem(ue, "input");
    udev_enumerate_add_match_subsystem(ue, "drm");

    if (m_types & Device_Mouse)
        udev_enumerate_add_match_property(ue, "ID_INPUT_MOUSE", "1");
    if (m_types & Device_Touchpad)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHPAD", "1");
    if (m_types & Device_Touchscreen)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TOUCHSCREEN", "1");
    if (m_types & Device_Keyboard) {
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEYBOARD", "1");
        udev_enumerate_add_match_property(ue, "ID_INPUT_KEY", "1");
    }
    if (m_types & Device_Tablet)
        udev_enumerate_add_match_property(ue, "ID_INPUT_TABLET", "1");
    if (m_types & Device_Joystick)
        udev_enumerate_add_match_property(ue, "ID_INPUT_JOYSTICK", "1");

    if (udev_enumerate_scan_devices(ue) != 0) {
        qWarning("Failed to scan devices");
        return devices;
    }

    udev_list_entry *entry;
    udev_list_entry_foreach (entry, udev_enumerate_get_list_entry(ue)) {
        const char *syspath = udev_list_entry_get_name(entry);
        udev_device *udevice = udev_device_new_from_syspath(m_udev, syspath);
        QString candidate = QString::fromUtf8(udev_device_get_devnode(udevice));
        if ((m_types & Device_InputMask) && candidate.startsWith(QT_EVDEV_DEVICE ""_L1))
            devices << candidate;
        if ((m_types & Device_VideoMask) && candidate.startsWith(QT_DRM_DEVICE ""_L1)) {
            if (m_types & Device_DRM_PrimaryGPU) {
                udev_device *pci = udev_device_get_parent_with_subsystem_devtype(udevice, "pci", 0);
                if (pci) {
                    if (qstrcmp(udev_device_get_sysattr_value(pci, "boot_vga"), "1") == 0)
                        devices << candidate;
                }
            } else
                devices << candidate;
        }

        udev_device_unref(udevice);
    }
    udev_enumerate_unref(ue);

    qCDebug(lcDD) << "Found matching devices" << devices;

    return devices;
}